

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O1

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  long *plVar4;
  PrintVisitor visitor;
  long *local_60;
  long local_58;
  long local_50 [2];
  undefined **local_40;
  ostream *local_38;
  int local_30;
  
  poVar3 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"FunctionResultCallNode:\n",0x18);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  poVar3 = this->stream_;
  local_30 = this->indentation_ + 1;
  local_40 = &PTR__Visitor_00156cf8;
  local_60 = local_50;
  local_38 = poVar3;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Function:\n",10);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  pEVar1 = (node->call_)._M_t.
           super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>._M_t.
           super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
           super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
  (**(code **)((long)(pEVar1->super_Node)._vptr_Node + 0x10))(pEVar1,&local_40);
  poVar3 = this->stream_;
  local_60 = local_50;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)this->indentation_);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_60,local_58);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Arguments:\n",0xb);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  iVar2 = (*(node->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])(node);
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  while (plVar4 = (long *)*plVar4, plVar4 != (long *)CONCAT44(extraout_var,iVar2)) {
    (**(code **)(*(long *)plVar4[2] + 0x10))((long *)plVar4[2],&local_40);
  }
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionResultCallNode& node)
{
  stream_ << indent() << "FunctionResultCallNode:\n";

  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  stream_ << indent() << "Function:\n";
  node.getCall().accept(visitor);
  
  stream_ << indent() << "Arguments:\n";
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}